

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberType(CppTypeName *this,StringPtr innerName)

{
  StringPtr *in_R8;
  char *local_58;
  size_t local_50;
  StringTree local_48;
  
  local_50 = innerName.content.size_;
  local_58 = innerName.content.ptr;
  kj::strTree<kj::StringTree,char_const(&)[3],kj::StringPtr&>
            (&local_48,(kj *)this,(StringTree *)0x23ffac,(char (*) [3])&local_58,in_R8);
  kj::StringTree::operator=(&this->name,&local_48);
  kj::StringTree::~StringTree(&local_48);
  this->needsTypename = this->isArgDependent;
  return;
}

Assistant:

void addMemberType(kj::StringPtr innerName) {
    // Append "::innerName" to refer to a member.

    name = kj::strTree(kj::mv(name), "::", innerName);
    needsTypename = isArgDependent;
  }